

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O0

void __thiscall
brotli::ZopfliCostModel::SetFromCommands
          (ZopfliCostModel *this,size_t num_bytes,size_t position,uint8_t *ringbuffer,
          size_t ringbuffer_mask,Command *commands,size_t num_commands,size_t last_insert_len)

{
  allocator<unsigned_int> *this_00;
  double dVar1;
  double dVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  reference pvVar7;
  reference pvVar8;
  double *pdVar9;
  size_type local_108;
  size_t i_2;
  undefined1 local_f8 [4];
  uint32_t i_1;
  vector<double,_std::allocator<double>_> cost_literal;
  size_t j;
  size_t cmdcode;
  size_t distcode;
  size_t copylength;
  size_t inslength;
  size_t i;
  size_t pos;
  undefined1 local_a0 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram_dist;
  undefined1 local_80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram_cmd;
  allocator<unsigned_int> local_55;
  value_type_conflict local_54;
  undefined1 local_50 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram_literal;
  Command *commands_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  ZopfliCostModel *this_local;
  
  local_54 = 0;
  histogram_literal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &commands->insert_len_;
  std::allocator<unsigned_int>::allocator(&local_55);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,0x100,&local_54,
             &local_55);
  std::allocator<unsigned_int>::~allocator(&local_55);
  histogram_dist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  this_00 = (allocator<unsigned_int> *)
            ((long)&histogram_dist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<unsigned_int>::allocator(this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,0x2c0,
             (value_type_conflict *)
             ((long)&histogram_dist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),this_00);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&histogram_dist.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  pos._4_4_ = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&pos + 3));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,0x208,
             (value_type_conflict *)((long)&pos + 4),(allocator<unsigned_int> *)((long)&pos + 3));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&pos + 3));
  i = position - last_insert_len;
  for (inslength = 0; inslength < num_commands; inslength = inslength + 1) {
    uVar4 = histogram_literal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage[inslength * 6];
    uVar5 = histogram_literal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage[inslength * 6 + 1];
    uVar3 = *(ushort *)
             ((long)histogram_literal.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + inslength * 0x18 + 0x16);
    uVar6 = histogram_literal.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage[inslength * 6 + 5];
    pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                        (ulong)(ushort)uVar6);
    *pvVar7 = *pvVar7 + 1;
    if (0x7f < (ulong)(ushort)uVar6) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,
                          (ulong)uVar3);
      *pvVar7 = *pvVar7 + 1;
    }
    for (cost_literal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cost_literal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage < (pointer)(ulong)uVar4;
        cost_literal.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)cost_literal.super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
                          (ulong)ringbuffer
                                 [i + (long)cost_literal.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage &
                                  ringbuffer_mask]);
      *pvVar7 = *pvVar7 + 1;
    }
    i = (long)(ulong)uVar4 + i + uVar5;
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_f8);
  Set(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50,
      (vector<double,_std::allocator<double>_> *)local_f8);
  Set(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,&this->cost_cmd_);
  Set(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0,&this->cost_dist_);
  for (i_2._4_4_ = 0; i_2._4_4_ < 0x2c0; i_2._4_4_ = i_2._4_4_ + 1) {
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->cost_cmd_,(ulong)i_2._4_4_);
    pdVar9 = std::min<double>(&this->min_cost_cmd_,pvVar8);
    this->min_cost_cmd_ = *pdVar9;
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->literal_costs_,num_bytes + 1);
  pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&this->literal_costs_,0);
  *pvVar8 = 0.0;
  for (local_108 = 0; local_108 < num_bytes; local_108 = local_108 + 1) {
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->literal_costs_,local_108);
    dVar1 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_f8,
                        (ulong)ringbuffer[position + local_108 & ringbuffer_mask]);
    dVar2 = *pvVar8;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->literal_costs_,local_108 + 1);
    *pvVar8 = dVar1 + dVar2;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_f8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_50);
  return;
}

Assistant:

void SetFromCommands(size_t num_bytes,
                       size_t position,
                       const uint8_t* ringbuffer,
                       size_t ringbuffer_mask,
                       const Command* commands,
                       size_t num_commands,
                       size_t last_insert_len) {
    std::vector<uint32_t> histogram_literal(256, 0);
    std::vector<uint32_t> histogram_cmd(kNumCommandPrefixes, 0);
    std::vector<uint32_t> histogram_dist(kNumDistancePrefixes, 0);

    size_t pos = position - last_insert_len;
    for (size_t i = 0; i < num_commands; i++) {
      size_t inslength = commands[i].insert_len_;
      size_t copylength = commands[i].copy_len_;
      size_t distcode = commands[i].dist_prefix_;
      size_t cmdcode = commands[i].cmd_prefix_;

      histogram_cmd[cmdcode]++;
      if (cmdcode >= 128) histogram_dist[distcode]++;

      for (size_t j = 0; j < inslength; j++) {
        histogram_literal[ringbuffer[(pos + j) & ringbuffer_mask]]++;
      }

      pos += inslength + copylength;
    }

    std::vector<double> cost_literal;
    Set(histogram_literal, &cost_literal);
    Set(histogram_cmd, &cost_cmd_);
    Set(histogram_dist, &cost_dist_);

    for (uint32_t i = 0; i < kNumCommandPrefixes; ++i) {
      min_cost_cmd_ = std::min(min_cost_cmd_, cost_cmd_[i]);
    }

    literal_costs_.resize(num_bytes + 1);
    literal_costs_[0] = 0.0;
    for (size_t i = 0; i < num_bytes; ++i) {
      literal_costs_[i + 1] = literal_costs_[i] +
          cost_literal[ringbuffer[(position + i) & ringbuffer_mask]];
    }
  }